

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_serializeNode(PyObject *self,PyObject *args)

{
  char *str;
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  PyObject *pPVar4;
  long lVar5;
  long lVar6;
  int format;
  char *encoding;
  PyObject *pyobj_node;
  int local_34;
  undefined8 local_30;
  undefined *local_28;
  
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Ozi:serializeNode",&local_28,&local_30,&local_34);
  if (iVar1 == 0) {
    return (PyObject *)0x0;
  }
  if (local_28 == &_Py_NoneStruct) {
    lVar3 = 0;
  }
  else {
    lVar3 = *(long *)(local_28 + 0x10);
  }
  if (lVar3 != 0) {
    iVar1 = *(int *)(lVar3 + 8);
    lVar5 = 0;
    if ((iVar1 == 9) || (iVar1 == 0xd)) {
      lVar6 = 0;
      lVar5 = lVar3;
    }
    else {
      if (iVar1 != 0x12) {
        lVar5 = *(long *)(lVar3 + 0x40);
      }
      lVar6 = lVar3;
      if (lVar5 == 0) {
        lVar5 = 0;
      }
      else if ((*(uint *)(lVar5 + 8) | 4) != 0xd) goto LAB_0013c27f;
    }
    puVar2 = (undefined8 *)xmlBufferCreate();
    if (puVar2 != (undefined8 *)0x0) {
      lVar3 = xmlSaveToBuffer(puVar2,local_30,local_34 != 0);
      if (lVar3 != 0) {
        if (lVar6 == 0) {
          xmlSaveDoc(lVar3,lVar5);
        }
        else {
          xmlSaveTree(lVar3,lVar6);
        }
        xmlSaveClose(lVar3);
        str = (char *)*puVar2;
        *puVar2 = 0;
        xmlBufferFree(puVar2);
        pPVar4 = libxml_charPtrWrap(str);
        return pPVar4;
      }
      xmlBufferFree(puVar2);
    }
  }
LAB_0013c27f:
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

static PyObject *
libxml_serializeNode(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    PyObject *py_retval = NULL;
    xmlChar *c_retval;
    PyObject *pyobj_node;
    xmlNodePtr node;
    xmlDocPtr doc;
    const char *encoding;
    int format;
    xmlSaveCtxtPtr ctxt;
    xmlBufferPtr buf;
    int options = 0;

    if (!PyArg_ParseTuple(args, (char *) "Ozi:serializeNode", &pyobj_node,
                          &encoding, &format))
        return (NULL);
    node = (xmlNodePtr) PyxmlNode_Get(pyobj_node);

    if (node == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    if (node->type == XML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
	node = NULL;
#ifdef LIBXML_HTML_ENABLED
    } else if (node->type == XML_HTML_DOCUMENT_NODE) {
        doc = (xmlDocPtr) node;
	node = NULL;
#endif
    } else {
        if (node->type == XML_NAMESPACE_DECL)
	    doc = NULL;
	else
            doc = node->doc;
        if ((doc == NULL) || (doc->type == XML_DOCUMENT_NODE)) {
#ifdef LIBXML_HTML_ENABLED
        } else if (doc->type == XML_HTML_DOCUMENT_NODE) {
#endif /* LIBXML_HTML_ENABLED */
        } else {
            Py_INCREF(Py_None);
            return (Py_None);
        }
    }


    buf = xmlBufferCreate();
    if (buf == NULL) {
	Py_INCREF(Py_None);
	return (Py_None);
    }
    if (format) options |= XML_SAVE_FORMAT;
    ctxt = xmlSaveToBuffer(buf, encoding, options);
    if (ctxt == NULL) {
	xmlBufferFree(buf);
	Py_INCREF(Py_None);
	return (Py_None);
    }
    if (node == NULL)
	xmlSaveDoc(ctxt, doc);
    else
	xmlSaveTree(ctxt, node);
    xmlSaveClose(ctxt);

    c_retval = buf->content;
    buf->content = NULL;

    xmlBufferFree(buf);
    py_retval = libxml_charPtrWrap((char *) c_retval);

    return (py_retval);
}